

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewConversion.h
# Opt level: O3

long __thiscall
gmlc::utilities::strViewToInteger<long>(utilities *this,string_view input,size_t *charactersUsed)

{
  char *pcVar1;
  out_of_range *this_00;
  long *plVar2;
  code *pcVar3;
  undefined *puVar4;
  char *__first;
  utilities *puVar5;
  utilities *puVar6;
  __integer_from_chars_result_type<long> _Var7;
  long val;
  long local_20;
  
  plVar2 = (long *)input._M_str;
  __first = (char *)input._M_len;
  local_20 = 0;
  if (plVar2 != (long *)0x0) {
    *plVar2 = 0;
  }
  puVar5 = (utilities *)0x0;
  if ((utilities *)0x1 < this) {
    do {
      if (__first[(long)puVar5] != ' ') {
        if ((__first[(long)puVar5] != '0') || ((byte)((__first + 1)[(long)puVar5] | 0x20U) == 0x78))
        {
          __first = __first + (long)puVar5;
          this = this + -(long)puVar5;
          goto LAB_0029a3d4;
        }
        puVar6 = puVar5;
        goto LAB_0029a411;
      }
      puVar5 = puVar5 + 1;
    } while (this != puVar5);
LAB_0029a3b4:
    if (plVar2 == (long *)0x0) {
      return 0;
    }
    goto LAB_0029a3fb;
  }
  goto LAB_0029a3d4;
  while (puVar5 = puVar6 + 1, pcVar1 = __first + 1 + (long)puVar6, puVar6 = puVar5, *pcVar1 == '0')
  {
LAB_0029a411:
    if (this + -1 == puVar6) goto LAB_0029a3b4;
  }
  this = this + -(long)puVar5;
  __first = __first + (long)puVar5;
LAB_0029a3d4:
  _Var7 = std::from_chars<long>(__first,(char *)(this + (long)__first),&local_20,10);
  if (_Var7.ec != 0) {
    if (_Var7.ec == result_out_of_range) {
      if (plVar2 != (long *)0x0) {
        *plVar2 = (long)_Var7.ptr - (long)__first;
      }
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range
                (this_00,"conversion type does not support the string conversion");
      puVar4 = &std::out_of_range::typeinfo;
      pcVar3 = std::out_of_range::~out_of_range;
    }
    else {
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                ((invalid_argument *)this_00,"unable to convert string");
      puVar4 = &std::invalid_argument::typeinfo;
      pcVar3 = std::invalid_argument::~invalid_argument;
    }
    __cxa_throw(this_00,puVar4,pcVar3);
  }
  if (plVar2 == (long *)0x0) {
    return local_20;
  }
  this = (utilities *)(_Var7.ptr + ((long)puVar5 - (long)__first));
LAB_0029a3fb:
  *plVar2 = (long)this;
  return local_20;
}

Assistant:

X strViewToInteger(std::string_view input, size_t* charactersUsed = nullptr)
{
    static_assert(std::is_integral_v<X>, "requested type is not integral");
    X val{0};
    if (charactersUsed != nullptr) {
        *charactersUsed = 0;
    }
    std::size_t additionalChars{0};
    if (input.size() > 1) {
        while (input[0] == ' ') {
            input.remove_prefix(1);
            ++additionalChars;
            if (input.empty()) {
                if (charactersUsed != nullptr) {
                    *charactersUsed = additionalChars;
                }
                return val;
            }
        }
        if (input.front() == '0') {
            if (input[1] != 'X' && input[1] != 'x') {
                while (input[0] == '0') {
                    input.remove_prefix(1);
                    ++additionalChars;
                    if (input.empty()) {
                        if (charactersUsed != nullptr) {
                            *charactersUsed = additionalChars;
                        }
                        return val;
                    }
                }
            }
        }
    }
    auto conversionResult =
        std::from_chars(input.data(), input.data() + input.size(), val);
    if (conversionResult.ec == std::errc()) {
        if (charactersUsed != nullptr) {
            *charactersUsed =
                (conversionResult.ptr - input.data()) + additionalChars;
        }
        return val;
    }
    if (conversionResult.ec == std::errc::result_out_of_range) {
        if (charactersUsed != nullptr) {
            *charactersUsed = (conversionResult.ptr - input.data());
        }
        throw(std::out_of_range(
            "conversion type does not support the string conversion"));
    }
    if constexpr (std::is_unsigned_v<X>) {
        if (input.size() > 1 && input.front() == '-') {
            auto signedVal =
                strViewToInteger<std::make_signed_t<X>>(input, charactersUsed);
            // additional chars must be 0 in this case otherwise it should have
            // been an error
            return static_cast<X>(signedVal);
        }
    }
    throw(std::invalid_argument("unable to convert string"));
}